

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O1

void init_module_trodesnetwork(void)

{
  keyword *pkVar1;
  char *pcVar2;
  self *this;
  class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar3;
  class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar4;
  class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar5;
  class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar6;
  class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *this_00;
  long lVar7;
  class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  *pcVar8;
  class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  *pcVar9;
  class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  *pcVar10;
  class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  *pcVar11;
  class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  *pcVar12;
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  *pcVar13;
  object_base local_128;
  undefined8 local_120;
  init_base<boost::python::init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
  local_118;
  init_base<boost::python::init<mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
  local_f8;
  keyword *local_e0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  keyword local_b0 [11];
  undefined1 local_a5;
  undefined1 local_a4;
  undefined1 local_a3;
  undefined1 local_a2;
  undefined1 local_a1;
  long *local_a0;
  code *local_98;
  undefined8 local_90;
  code *local_88;
  undefined8 local_80;
  code *local_78;
  undefined8 local_70;
  code *local_68;
  undefined8 local_60;
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  code *local_38;
  undefined8 local_30;
  code *local_28;
  undefined8 local_20;
  
  PyEval_InitThreads();
  Py_Initialize();
  boost::python::numpy::initialize(true);
  boost::python::converter::registry::insert
            (boost::python::converter::
             as_to_python_function<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_vecToList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::convert,
             (type_info)"St6vectorINSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEESaIS5_EE",
             boost::python::
             to_python_converter<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_vecToList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
             ::get_pytype_impl);
  boost::python::converter::registry::insert
            (boost::python::converter::
             as_to_python_function<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_vecToList<unsigned_char>_>
             ::convert,(type_info)"St6vectorIhSaIhEE",
             boost::python::
             to_python_converter<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_vecToList<unsigned_char>,_false>
             ::get_pytype_impl);
  boost::python::converter::registry::insert
            (boost::python::converter::
             as_to_python_function<std::vector<int,_std::allocator<int>_>,_vecToList<int>_>::convert
             ,(type_info)"St6vectorIiSaIiEE",
             boost::python::
             to_python_converter<std::vector<int,_std::allocator<int>_>,_vecToList<int>,_false>::
             get_pytype_impl);
  boost::python::converter::registry::insert
            (boost::python::converter::
             as_to_python_function<std::vector<EventDataType,_std::allocator<EventDataType>_>,_EventVecToDict>
             ::convert,(type_info)"St6vectorI13EventDataTypeSaIS0_EE",
             boost::python::
             to_python_converter<std::vector<EventDataType,_std::allocator<EventDataType>_>,_EventVecToDict,_false>
             ::get_pytype_impl);
  boost::python::converter::registry::insert
            (boost::python::converter::
             as_to_python_function<std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>,_vecToList<HighFreqDataType>_>
             ::convert,(type_info)"St6vectorI16HighFreqDataTypeSaIS0_EE",
             boost::python::
             to_python_converter<std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>,_vecToList<HighFreqDataType>,_false>
             ::get_pytype_impl);
  boost::python::converter::registry::insert
            (boost::python::converter::as_to_python_function<TrodesMsg,_TrodesMsgToList>::convert,
             (type_info)"9TrodesMsg",
             boost::python::to_python_converter<TrodesMsg,_TrodesMsgToList,_false>::get_pytype_impl)
  ;
  boost::python::converter::registry::insert
            (boost::python::converter::as_to_python_function<lfpPacket,_lfpPacketToList>::convert,
             (type_info)"9lfpPacket",
             boost::python::to_python_converter<lfpPacket,_lfpPacketToList,_false>::get_pytype_impl)
  ;
  local_118.m_keywords.first = boost::python::detail::current_scope;
  local_118.m_doc = (char *)boost::python::detail::current_scope;
  if (boost::python::detail::current_scope == (keyword *)0x0) {
    local_118.m_doc = &_Py_NoneStruct;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  if (local_118.m_keywords.first != (keyword *)0x0) {
    *(long *)&(local_118.m_keywords.first)->field_0x0 =
         *(long *)&(local_118.m_keywords.first)->field_0x0 + 1;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  local_f8.m_keywords.first = (keyword *)0x363fa6;
  local_f8.m_doc = local_118.m_doc;
  local_128.m_ptr =
       boost::python::api::object_initializer_impl<false,_false>::get<char[7]>("Trodes");
  boost::python::api::setattr((object *)&local_f8,"TRODES_NETWORK_ID",(object *)&local_128);
  (local_128.m_ptr)->ob_refcnt = (local_128.m_ptr)->ob_refcnt + -1;
  if ((local_128.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_f8.m_doc = *(long *)local_f8.m_doc + -1;
  if (*(long *)local_f8.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = local_118.m_keywords.first;
  *(long *)local_118.m_doc = *(long *)local_118.m_doc + -1;
  if (*(long *)local_118.m_doc == 0) {
    _Py_Dealloc();
  }
  local_118.m_keywords.first = boost::python::detail::current_scope;
  local_118.m_doc = (char *)boost::python::detail::current_scope;
  if (boost::python::detail::current_scope == (keyword *)0x0) {
    local_118.m_doc = &_Py_NoneStruct;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  if (local_118.m_keywords.first != (keyword *)0x0) {
    *(long *)&(local_118.m_keywords.first)->field_0x0 =
         *(long *)&(local_118.m_keywords.first)->field_0x0 + 1;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  local_f8.m_keywords.first = (keyword *)0x363fb8;
  local_f8.m_doc = local_118.m_doc;
  local_128.m_ptr =
       boost::python::api::object_initializer_impl<false,_false>::get<char[16]>("tcp://127.0.0.1");
  boost::python::api::setattr((object *)&local_f8,"DEFAULT_SERVER_ADDRESS",(object *)&local_128);
  (local_128.m_ptr)->ob_refcnt = (local_128.m_ptr)->ob_refcnt + -1;
  if ((local_128.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_f8.m_doc = *(long *)local_f8.m_doc + -1;
  if (*(long *)local_f8.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = local_118.m_keywords.first;
  *(long *)local_118.m_doc = *(long *)local_118.m_doc + -1;
  if (*(long *)local_118.m_doc == 0) {
    _Py_Dealloc();
  }
  local_118.m_keywords.first = boost::python::detail::current_scope;
  local_118.m_doc = (char *)boost::python::detail::current_scope;
  if (boost::python::detail::current_scope == (keyword *)0x0) {
    local_118.m_doc = &_Py_NoneStruct;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  if (local_118.m_keywords.first != (keyword *)0x0) {
    *(long *)&(local_118.m_keywords.first)->field_0x0 =
         *(long *)&(local_118.m_keywords.first)->field_0x0 + 1;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  local_f8.m_keywords.first = (keyword *)0x363fcf;
  local_f8.m_doc = local_118.m_doc;
  local_128.m_ptr =
       boost::python::api::object_initializer_impl<false,_false>::get<int>(&DEFAULT_SERVER_PORT);
  boost::python::api::setattr((object *)&local_f8,"DEFAULT_SERVER_PORT",(object *)&local_128);
  (local_128.m_ptr)->ob_refcnt = (local_128.m_ptr)->ob_refcnt + -1;
  if ((local_128.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_f8.m_doc = *(long *)local_f8.m_doc + -1;
  if (*(long *)local_f8.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = local_118.m_keywords.first;
  *(long *)local_118.m_doc = *(long *)local_118.m_doc + -1;
  if (*(long *)local_118.m_doc == 0) {
    _Py_Dealloc();
  }
  local_118.m_keywords.first = boost::python::detail::current_scope;
  local_118.m_doc = (char *)boost::python::detail::current_scope;
  if (boost::python::detail::current_scope == (keyword *)0x0) {
    local_118.m_doc = &_Py_NoneStruct;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  if (local_118.m_keywords.first != (keyword *)0x0) {
    *(long *)&(local_118.m_keywords.first)->field_0x0 =
         *(long *)&(local_118.m_keywords.first)->field_0x0 + 1;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  local_f8.m_keywords.first = (keyword *)0x363fe3;
  local_f8.m_doc = local_118.m_doc;
  local_128.m_ptr =
       boost::python::api::object_initializer_impl<false,_false>::get<char[12]>("neurostream");
  boost::python::api::setattr((object *)&local_f8,"NEURALSTREAM",(object *)&local_128);
  (local_128.m_ptr)->ob_refcnt = (local_128.m_ptr)->ob_refcnt + -1;
  if ((local_128.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_f8.m_doc = *(long *)local_f8.m_doc + -1;
  if (*(long *)local_f8.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = local_118.m_keywords.first;
  *(long *)local_118.m_doc = *(long *)local_118.m_doc + -1;
  if (*(long *)local_118.m_doc == 0) {
    _Py_Dealloc();
  }
  local_118.m_keywords.first = boost::python::detail::current_scope;
  local_118.m_doc = (char *)boost::python::detail::current_scope;
  if (boost::python::detail::current_scope == (keyword *)0x0) {
    local_118.m_doc = &_Py_NoneStruct;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  if (local_118.m_keywords.first != (keyword *)0x0) {
    *(long *)&(local_118.m_keywords.first)->field_0x0 =
         *(long *)&(local_118.m_keywords.first)->field_0x0 + 1;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  local_f8.m_keywords.first = (keyword *)0x363ff0;
  local_f8.m_doc = local_118.m_doc;
  local_128.m_ptr =
       boost::python::api::object_initializer_impl<false,_false>::get<char[13]>("analogstream");
  boost::python::api::setattr((object *)&local_f8,"ANALOGSTREAM",(object *)&local_128);
  (local_128.m_ptr)->ob_refcnt = (local_128.m_ptr)->ob_refcnt + -1;
  if ((local_128.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_f8.m_doc = *(long *)local_f8.m_doc + -1;
  if (*(long *)local_f8.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = local_118.m_keywords.first;
  *(long *)local_118.m_doc = *(long *)local_118.m_doc + -1;
  if (*(long *)local_118.m_doc == 0) {
    _Py_Dealloc();
  }
  local_118.m_keywords.first = boost::python::detail::current_scope;
  local_118.m_doc = (char *)boost::python::detail::current_scope;
  if (boost::python::detail::current_scope == (keyword *)0x0) {
    local_118.m_doc = &_Py_NoneStruct;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  if (local_118.m_keywords.first != (keyword *)0x0) {
    *(long *)&(local_118.m_keywords.first)->field_0x0 =
         *(long *)&(local_118.m_keywords.first)->field_0x0 + 1;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  local_f8.m_keywords.first = (keyword *)0x363ffd;
  local_f8.m_doc = local_118.m_doc;
  local_128.m_ptr =
       boost::python::api::object_initializer_impl<false,_false>::get<char[14]>("digitalstream");
  boost::python::api::setattr((object *)&local_f8,"DIGITALSTREAM",(object *)&local_128);
  (local_128.m_ptr)->ob_refcnt = (local_128.m_ptr)->ob_refcnt + -1;
  if ((local_128.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_f8.m_doc = *(long *)local_f8.m_doc + -1;
  if (*(long *)local_f8.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = local_118.m_keywords.first;
  *(long *)local_118.m_doc = *(long *)local_118.m_doc + -1;
  if (*(long *)local_118.m_doc == 0) {
    _Py_Dealloc();
  }
  local_118.m_keywords.first = boost::python::detail::current_scope;
  local_118.m_doc = (char *)boost::python::detail::current_scope;
  if (boost::python::detail::current_scope == (keyword *)0x0) {
    local_118.m_doc = &_Py_NoneStruct;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  if (local_118.m_keywords.first != (keyword *)0x0) {
    *(long *)&(local_118.m_keywords.first)->field_0x0 =
         *(long *)&(local_118.m_keywords.first)->field_0x0 + 1;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  local_f8.m_keywords.first = (keyword *)0x36400b;
  local_f8.m_doc = local_118.m_doc;
  local_128.m_ptr =
       boost::python::api::object_initializer_impl<false,_false>::get<char[12]>("spikestream");
  boost::python::api::setattr((object *)&local_f8,"SPIKESTREAM",(object *)&local_128);
  (local_128.m_ptr)->ob_refcnt = (local_128.m_ptr)->ob_refcnt + -1;
  if ((local_128.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_f8.m_doc = *(long *)local_f8.m_doc + -1;
  if (*(long *)local_f8.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = local_118.m_keywords.first;
  *(long *)local_118.m_doc = *(long *)local_118.m_doc + -1;
  if (*(long *)local_118.m_doc == 0) {
    _Py_Dealloc();
  }
  local_118.m_keywords.first = boost::python::detail::current_scope;
  local_118.m_doc = (char *)boost::python::detail::current_scope;
  if (boost::python::detail::current_scope == (keyword *)0x0) {
    local_118.m_doc = &_Py_NoneStruct;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  if (local_118.m_keywords.first != (keyword *)0x0) {
    *(long *)&(local_118.m_keywords.first)->field_0x0 =
         *(long *)&(local_118.m_keywords.first)->field_0x0 + 1;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  local_f8.m_keywords.first = (keyword *)0x364017;
  local_f8.m_doc = local_118.m_doc;
  local_128.m_ptr =
       boost::python::api::object_initializer_impl<false,_false>::get<char[10]>("lfpstream");
  boost::python::api::setattr((object *)&local_f8,"LFPSTREAM",(object *)&local_128);
  (local_128.m_ptr)->ob_refcnt = (local_128.m_ptr)->ob_refcnt + -1;
  if ((local_128.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_f8.m_doc = *(long *)local_f8.m_doc + -1;
  if (*(long *)local_f8.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = local_118.m_keywords.first;
  *(long *)local_118.m_doc = *(long *)local_118.m_doc + -1;
  if (*(long *)local_118.m_doc == 0) {
    _Py_Dealloc();
  }
  local_118.m_keywords.first = boost::python::detail::current_scope;
  local_118.m_doc = (char *)boost::python::detail::current_scope;
  if (boost::python::detail::current_scope == (keyword *)0x0) {
    local_118.m_doc = &_Py_NoneStruct;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  if (local_118.m_keywords.first != (keyword *)0x0) {
    *(long *)&(local_118.m_keywords.first)->field_0x0 =
         *(long *)&(local_118.m_keywords.first)->field_0x0 + 1;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  local_f8.m_keywords.first = (keyword *)0x364021;
  local_f8.m_doc = local_118.m_doc;
  local_128.m_ptr = boost::python::api::object_initializer_impl<false,_false>::get<char[5]>("play");
  boost::python::api::setattr((object *)&local_f8,"acq_PLAY",(object *)&local_128);
  (local_128.m_ptr)->ob_refcnt = (local_128.m_ptr)->ob_refcnt + -1;
  if ((local_128.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_f8.m_doc = *(long *)local_f8.m_doc + -1;
  if (*(long *)local_f8.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = local_118.m_keywords.first;
  *(long *)local_118.m_doc = *(long *)local_118.m_doc + -1;
  if (*(long *)local_118.m_doc == 0) {
    _Py_Dealloc();
  }
  local_118.m_keywords.first = boost::python::detail::current_scope;
  local_118.m_doc = (char *)boost::python::detail::current_scope;
  if (boost::python::detail::current_scope == (keyword *)0x0) {
    local_118.m_doc = &_Py_NoneStruct;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  if (local_118.m_keywords.first != (keyword *)0x0) {
    *(long *)&(local_118.m_keywords.first)->field_0x0 =
         *(long *)&(local_118.m_keywords.first)->field_0x0 + 1;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  local_f8.m_keywords.first = (keyword *)0x36402a;
  local_f8.m_doc = local_118.m_doc;
  local_128.m_ptr = boost::python::api::object_initializer_impl<false,_false>::get<char[5]>("stop");
  boost::python::api::setattr((object *)&local_f8,"acq_STOP",(object *)&local_128);
  (local_128.m_ptr)->ob_refcnt = (local_128.m_ptr)->ob_refcnt + -1;
  if ((local_128.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_f8.m_doc = *(long *)local_f8.m_doc + -1;
  if (*(long *)local_f8.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = local_118.m_keywords.first;
  *(long *)local_118.m_doc = *(long *)local_118.m_doc + -1;
  if (*(long *)local_118.m_doc == 0) {
    _Py_Dealloc();
  }
  local_118.m_keywords.first = boost::python::detail::current_scope;
  local_118.m_doc = (char *)boost::python::detail::current_scope;
  if (boost::python::detail::current_scope == (keyword *)0x0) {
    local_118.m_doc = &_Py_NoneStruct;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  if (local_118.m_keywords.first != (keyword *)0x0) {
    *(long *)&(local_118.m_keywords.first)->field_0x0 =
         *(long *)&(local_118.m_keywords.first)->field_0x0 + 1;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  local_f8.m_keywords.first = (keyword *)0x364033;
  local_f8.m_doc = local_118.m_doc;
  local_128.m_ptr = boost::python::api::object_initializer_impl<false,_false>::get<char[6]>("pause")
  ;
  boost::python::api::setattr((object *)&local_f8,"acq_PAUSE",(object *)&local_128);
  (local_128.m_ptr)->ob_refcnt = (local_128.m_ptr)->ob_refcnt + -1;
  if ((local_128.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_f8.m_doc = *(long *)local_f8.m_doc + -1;
  if (*(long *)local_f8.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = local_118.m_keywords.first;
  *(long *)local_118.m_doc = *(long *)local_118.m_doc + -1;
  if (*(long *)local_118.m_doc == 0) {
    _Py_Dealloc();
  }
  local_118.m_keywords.first = boost::python::detail::current_scope;
  local_118.m_doc = (char *)boost::python::detail::current_scope;
  if (boost::python::detail::current_scope == (keyword *)0x0) {
    local_118.m_doc = &_Py_NoneStruct;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  if (local_118.m_keywords.first != (keyword *)0x0) {
    *(long *)&(local_118.m_keywords.first)->field_0x0 =
         *(long *)&(local_118.m_keywords.first)->field_0x0 + 1;
  }
  *(long *)&((keyword *)local_118.m_doc)->field_0x0 =
       *(long *)&((keyword *)local_118.m_doc)->field_0x0 + 1;
  local_f8.m_keywords.first = (keyword *)0x36403d;
  local_f8.m_doc = local_118.m_doc;
  local_128.m_ptr = boost::python::api::object_initializer_impl<false,_false>::get<char[5]>("seek");
  boost::python::api::setattr((object *)&local_f8,"acq_SEEK",(object *)&local_128);
  (local_128.m_ptr)->ob_refcnt = (local_128.m_ptr)->ob_refcnt + -1;
  if ((local_128.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  *(long *)local_f8.m_doc = *(long *)local_f8.m_doc + -1;
  if (*(long *)local_f8.m_doc == 0) {
    _Py_Dealloc();
  }
  pkVar1 = boost::python::detail::current_scope;
  if (boost::python::detail::current_scope != (keyword *)0x0) {
    *(long *)&boost::python::detail::current_scope->field_0x0 =
         *(long *)&boost::python::detail::current_scope->field_0x0 + -1;
    if (*(long *)&pkVar1->field_0x0 == 0) {
      _Py_Dealloc();
    }
  }
  boost::python::detail::current_scope = local_118.m_keywords.first;
  *(long *)local_118.m_doc = *(long *)local_118.m_doc + -1;
  if (*(long *)local_118.m_doc == 0) {
    _Py_Dealloc();
  }
  boost::python::
  class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::class_((class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
            *)&local_f8,"timestamp_t",(char *)0x0);
  this = boost::python::
         class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
         ::add_property<unsigned_int_timestamp_t::*>
                   ((class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
                     *)&local_f8,"trodes_timestamp",0,(char *)0x0);
  boost::python::
  class_<timestamp_t,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::add_property<long_timestamp_t::*>(this,"system_timestamp",8,(char *)0x0);
  *(long *)local_f8.m_doc = *(long *)local_f8.m_doc + -1;
  if (*(long *)local_f8.m_doc == 0) {
    _Py_Dealloc();
  }
  boost::python::def<long(*)()>("systemTimeMSecs",CZHelp::systemTimeMSecs);
  boost::python::
  class_<HighFreqDataType,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::class_((class_<HighFreqDataType,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
            *)&local_f8,"HighFreqDataType",(char *)0x0);
  pcVar3 = (class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              add_property<std::__cxx11::string(HighFreqDataType::*)()const,void(HighFreqDataType::*)(std::__cxx11::string_const&)>
                        ((class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                          *)&local_f8,"name",(first_type)HighFreqDataType::getName_abi_cxx11_,0,
                         (char *)HighFreqDataType::setName);
  pcVar3 = (class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              add_property<std::__cxx11::string(HighFreqDataType::*)()const,void(HighFreqDataType::*)(std::__cxx11::string_const&)>
                        (pcVar3,"origin",(first_type)HighFreqDataType::getOrigin_abi_cxx11_,0,
                         (char *)HighFreqDataType::setOrigin);
  pcVar3 = (class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              add_property<std::__cxx11::string(HighFreqDataType::*)()const,void(HighFreqDataType::*)(std::__cxx11::string_const&)>
                        (pcVar3,"dataFormat",(first_type)HighFreqDataType::getDataFormat_abi_cxx11_,
                         0,(char *)HighFreqDataType::setDataFormat);
  pcVar3 = (class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              add_property<std::__cxx11::string(HighFreqDataType::*)()const,void(HighFreqDataType::*)(std::__cxx11::string_const&)>
                        (pcVar3,"address",(first_type)HighFreqDataType::getSockAddr_abi_cxx11_,0,
                         (char *)HighFreqDataType::setSockAddr);
  pcVar3 = (class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::add_property<int(HighFreqDataType::*)()const,void(HighFreqDataType::*)(int)>
                        (pcVar3,"byteSize",(first_type)HighFreqDataType::getByteSize,0,
                         (char *)HighFreqDataType::setByteSize);
  pcVar3 = (class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<bool(HighFreqDataType::*)()const>
                        (pcVar3,"isValid",(first_type)HighFreqDataType::isValid);
  boost::python::
  class_<HighFreqDataType,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(HighFreqDataType::*)()>(pcVar3,"print",(first_type)HighFreqDataType::print);
  *(long *)local_f8.m_doc = *(long *)local_f8.m_doc + -1;
  if (*(long *)local_f8.m_doc == 0) {
    _Py_Dealloc();
  }
  local_f8.m_doc = (char *)0x0;
  local_f8.m_keywords.first = (keyword *)0x0;
  local_f8.m_keywords.second = (keyword *)0x0;
  boost::python::
  class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_118,"StimulationCommand",&local_f8);
  pcVar4 = (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<bool(StimulationCommand::*)(int)>
                        ((class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                          *)&local_118,"setGroup",(first_type)StimulationCommand::setGroup);
  pcVar4 = (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(StimulationCommand::*)()>
                        (pcVar4,"setNoGroup",(first_type)StimulationCommand::setNoGroup);
  pcVar4 = (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<bool(StimulationCommand::*)(int)>
                        (pcVar4,"setSlot",(first_type)StimulationCommand::setSlot);
  pcVar4 = (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<bool(StimulationCommand::*)(int,int,int,int)>
                        (pcVar4,"setChannels",(first_type)StimulationCommand::setChannels);
  pcVar4 = (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::
              def<unsigned_char(StimulationCommand::*)(unsigned_short,unsigned_char,unsigned_short,unsigned_char,unsigned_short,unsigned_short,unsigned_short)>
                        (pcVar4,"setBiphasicPulseShape",
                         (first_type)StimulationCommand::setBiphasicPulseShape);
  pcVar4 = (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(StimulationCommand::*)(unsigned_short)>
                        (pcVar4,"setNumPulsesInTrain",
                         (first_type)StimulationCommand::setNumPulsesInTrain);
  boost::python::
  class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<bool(StimulationCommand::*)()>(pcVar4,"isValid",(first_type)StimulationCommand::isValid);
  *(long *)local_118.m_doc = *(long *)local_118.m_doc + -1;
  if (*(long *)local_118.m_doc == 0) {
    _Py_Dealloc();
  }
  boost::python::objects::enum_base::enum_base
            ((enum_base *)&local_f8,"CurrentScaling",
             boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::to_python,
             boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::
             convertible_from_python,
             boost::python::enum_<GlobalStimulationSettings::CurrentScaling>::construct,
             (type_info)"N25GlobalStimulationSettings14CurrentScalingE",(char *)0x0);
  boost::python::objects::enum_base::add_value((enum_base *)&local_f8,"max10nA",0);
  boost::python::objects::enum_base::add_value((enum_base *)&local_f8,"max20nA",1);
  boost::python::objects::enum_base::add_value((enum_base *)&local_f8,"max50nA",2);
  boost::python::objects::enum_base::add_value((enum_base *)&local_f8,"max100nA",3);
  boost::python::objects::enum_base::add_value((enum_base *)&local_f8,"max200nA",4);
  boost::python::objects::enum_base::add_value((enum_base *)&local_f8,"max500nA",5);
  boost::python::objects::enum_base::add_value((enum_base *)&local_f8,"max1uA",6);
  boost::python::objects::enum_base::add_value((enum_base *)&local_f8,"max2uA",7);
  boost::python::objects::enum_base::add_value((enum_base *)&local_f8,"max5uA",8);
  boost::python::objects::enum_base::add_value((enum_base *)&local_f8,"max10uA",9);
  *(long *)local_f8.m_doc = *(long *)local_f8.m_doc + -1;
  if (*(long *)local_f8.m_doc == 0) {
    _Py_Dealloc();
  }
  local_f8.m_doc = (char *)0x0;
  local_f8.m_keywords.first = (keyword *)0x0;
  local_f8.m_keywords.second = (keyword *)0x0;
  boost::python::
  class_<GlobalStimulationSettings,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<GlobalStimulationSettings,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_118,"GlobalStimulationSettings",&local_f8);
  boost::python::
  class_<GlobalStimulationSettings,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(GlobalStimulationSettings::*)(GlobalStimulationSettings::CurrentScaling)>
            ((class_<GlobalStimulationSettings,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_118,"setVoltageScale",(first_type)GlobalStimulationSettings::setVoltageScale)
  ;
  *(long *)local_118.m_doc = *(long *)local_118.m_doc + -1;
  if (*(long *)local_118.m_doc == 0) {
    _Py_Dealloc();
  }
  local_f8.m_doc = (char *)0x0;
  local_f8.m_keywords.first = (keyword *)0x0;
  local_f8.m_keywords.second = (keyword *)0x0;
  boost::python::
  class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  class_<boost::python::init<mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>
            ((class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_118,"GlobalStimulationCommand",&local_f8);
  pcVar5 = (class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(GlobalStimulationCommand::*)(bool)>
                        ((class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                          *)&local_118,"setStimEnabled",
                         (first_type)GlobalStimulationCommand::setStimEnabled);
  pcVar5 = (class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(GlobalStimulationCommand::*)()>
                        (pcVar5,"setResetSequencer",
                         (first_type)GlobalStimulationCommand::setResetSequencer);
  pcVar5 = (class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(GlobalStimulationCommand::*)()>
                        (pcVar5,"setAbortStimulation",
                         (first_type)GlobalStimulationCommand::setAbortStimulation);
  boost::python::
  class_<GlobalStimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(GlobalStimulationCommand::*)()>
            (pcVar5,"setClearDSPOffset",(first_type)GlobalStimulationCommand::setClearDSPOffset);
  *(long *)local_118.m_doc = *(long *)local_118.m_doc + -1;
  if (*(long *)local_118.m_doc == 0) {
    _Py_Dealloc();
  }
  pcVar2 = _str;
  local_f8.m_doc = (char *)0x0;
  local_f8.m_keywords.first = (keyword *)0x0;
  local_f8.m_keywords.second = (keyword *)0x0;
  local_118.m_doc = "13HFSubConsumer";
  boost::python::objects::class_base::class_base
            ((class_base *)&local_128,"HFSubConsumer",1,(type_info *)&local_118,(char *)0x0);
  boost::python::
  class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  initialize<boost::python::init_base<boost::python::init<HighFreqDataType,int,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>>
            ((class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_128,
             (init_base<boost::python::init<HighFreqDataType,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)&local_f8);
  pcVar6 = (class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<void(HFSubConsumer::*)()>
                        ((class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
                          *)&local_128,"initialize",0x11);
  pcVar6 = (class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<unsigned_long(HFSubConsumer::*)(boost::python::numpy::ndarray)>
                        (pcVar6,"readData",(first_type)HFSubConsumer_python::readData_python);
  pcVar6 = (class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<unsigned_long(HFSubConsumer::*)(long)>
                        (pcVar6,"available",(first_type)HFSubConsumer::available);
  pcVar6 = (class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
            *)boost::python::
              class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
              ::def<HighFreqDataType(HighFreqSub::*)()>
                        (pcVar6,"getDataType",(first_type)HighFreqSub::getType);
  boost::python::
  class_<HFSubConsumer_python,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<long(HFSubConsumer::*)()const>
            (pcVar6,"lastSysTimestamp",(first_type)HFSubConsumer::lastSysTimestamp);
  (local_128.m_ptr)->ob_refcnt = (local_128.m_ptr)->ob_refcnt + -1;
  if ((local_128.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  boost::python::
  class_<HFParsingInfo,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
  ::class_((class_<HFParsingInfo,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
            *)&local_f8,"HFParsingInfo",(char *)0x0);
  this_00 = (class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               add_property<std::vector<int,std::allocator<int>>HFParsingInfo::*,std::vector<int,std::allocator<int>>HFParsingInfo::*>
                         ((class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                           *)&local_f8,"indices",0,0,(char *)0x0);
  boost::python::
  class_<HFParsingInfo,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::add_property<unsigned_long_HFParsingInfo::*,unsigned_long_HFParsingInfo::*>
            (this_00,"sizeOf",0x18,0x18,(char *)0x0);
  *(long *)local_f8.m_doc = *(long *)local_f8.m_doc + -1;
  if (*(long *)local_f8.m_doc == 0) {
    _Py_Dealloc();
  }
  local_f8.m_doc = (char *)0x0;
  local_f8.m_keywords.first = (keyword *)0x0;
  local_f8.m_keywords.second = (keyword *)0x0;
  lVar7 = 0;
  do {
    *(char **)((long)&local_118.m_doc + lVar7) = pcVar2 + (*pcVar2 == '*');
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x10);
  local_118.m_doc = "11LFPConsumer";
  local_118.m_keywords.first = (keyword *)0x365b27;
  boost::python::objects::class_base::class_base
            ((class_base *)&local_128,"LFPConsumer",2,(type_info *)&local_118,(char *)0x0);
  boost::python::
  class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  initialize<boost::python::init_base<boost::python::init<HighFreqDataType,int,HFParsingInfo,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>>
            ((class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_128,
             (init_base<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)&local_f8);
  pcVar8 = (class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<void(LFPConsumer::*)()>
                        ((class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
                          *)&local_128,"initialize",0x11);
  pcVar8 = (class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<timestamp_t(LFPConsumer_python::*)()>
                        (pcVar8,"getData",(first_type)LFPConsumer_python::getData_python);
  pcVar8 = (class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<unsigned_long(HFSubConsumer::*)(long)>
                        (pcVar8,"available",(first_type)HFSubConsumer::available);
  pcVar8 = (class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<boost::python::numpy::ndarray(LFPConsumer_python::*)()>
                        (pcVar8,"create_numpy_array",
                         (first_type)LFPConsumer_python::create_numpy_array);
  pcVar8 = (class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<long(HFSubConsumer::*)()const>
                        (pcVar8,"lastSysTimestamp",(first_type)HFSubConsumer::lastSysTimestamp);
  boost::python::
  class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(LFPConsumer::*)()const>
            (pcVar8,"getNTrodesRequested",(first_type)LFPConsumer::getNTrodesRequested_abi_cxx11_);
  (local_128.m_ptr)->ob_refcnt = (local_128.m_ptr)->ob_refcnt + -1;
  if ((local_128.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  local_f8.m_doc = (char *)0x0;
  local_f8.m_keywords.first = (keyword *)0x0;
  local_f8.m_keywords.second = (keyword *)0x0;
  lVar7 = 0;
  do {
    *(char **)((long)&local_118.m_doc + lVar7) = pcVar2 + (*pcVar2 == '*');
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x10);
  local_118.m_doc = "14SpikesConsumer";
  local_118.m_keywords.first = (keyword *)0x365b27;
  boost::python::objects::class_base::class_base
            ((class_base *)&local_128,"SpikesConsumer",2,(type_info *)&local_118,(char *)0x0);
  boost::python::
  class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  initialize<boost::python::init_base<boost::python::init<HighFreqDataType,int,HFParsingInfo,int,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>>
            ((class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_128,
             (init_base<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_int,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)&local_f8);
  pcVar9 = (class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<void(SpikesConsumer::*)()>
                        ((class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
                          *)&local_128,"initialize",0x11);
  pcVar9 = (class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<timestamp_t(SpikesConsumer_python::*)()>
                        (pcVar9,"getData",(first_type)SpikesConsumer_python::getData_python);
  pcVar9 = (class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<unsigned_long(HFSubConsumer::*)(long)>
                        (pcVar9,"available",(first_type)HFSubConsumer::available);
  pcVar9 = (class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<boost::python::numpy::ndarray(SpikesConsumer_python::*)()>
                        (pcVar9,"create_numpy_array",
                         (first_type)SpikesConsumer_python::create_numpy_array);
  pcVar9 = (class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
            *)boost::python::
              class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              ::def<long(HFSubConsumer::*)()const>
                        (pcVar9,"lastSysTimestamp",(first_type)HFSubConsumer::lastSysTimestamp);
  boost::python::
  class_<SpikesConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(SpikesConsumer::*)()const>
            (pcVar9,"getNTrodesRequested",(first_type)SpikesConsumer::getNTrodesRequested_abi_cxx11_
            );
  (local_128.m_ptr)->ob_refcnt = (local_128.m_ptr)->ob_refcnt + -1;
  if ((local_128.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  local_f8.m_doc = (char *)0x0;
  local_f8.m_keywords.first = (keyword *)0x0;
  local_f8.m_keywords.second = (keyword *)0x0;
  lVar7 = 0;
  do {
    *(char **)((long)&local_118.m_doc + lVar7) = pcVar2 + (*pcVar2 == '*');
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x10);
  local_118.m_doc = "14AnalogConsumer";
  local_118.m_keywords.first = (keyword *)0x365b27;
  boost::python::objects::class_base::class_base
            ((class_base *)&local_128,"AnalogConsumer",2,(type_info *)&local_118,(char *)0x0);
  boost::python::
  class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  initialize<boost::python::init_base<boost::python::init<HighFreqDataType,int,HFParsingInfo,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>>
            ((class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_128,
             (init_base<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)&local_f8);
  pcVar10 = (class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<void(AnalogConsumer::*)()>
                         ((class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
                           *)&local_128,"initialize",0x11);
  pcVar10 = (class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<timestamp_t(AnalogConsumer_python::*)()>
                         (pcVar10,"getData",(first_type)AnalogConsumer_python::getData_python);
  pcVar10 = (class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<unsigned_long(HFSubConsumer::*)(long)>
                         (pcVar10,"available",(first_type)HFSubConsumer::available);
  pcVar10 = (class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<boost::python::numpy::ndarray(AnalogConsumer_python::*)()>
                         (pcVar10,"create_numpy_array",
                          (first_type)AnalogConsumer_python::create_numpy_array);
  pcVar10 = (class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<long(HFSubConsumer::*)()const>
                         (pcVar10,"lastSysTimestamp",(first_type)HFSubConsumer::lastSysTimestamp);
  boost::python::
  class_<AnalogConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(AnalogConsumer::*)()const>
            (pcVar10,"getChannelsRequested",
             (first_type)AnalogConsumer::getChannelsRequested_abi_cxx11_);
  (local_128.m_ptr)->ob_refcnt = (local_128.m_ptr)->ob_refcnt + -1;
  if ((local_128.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  local_f8.m_doc = (char *)0x0;
  local_f8.m_keywords.first = (keyword *)0x0;
  local_f8.m_keywords.second = (keyword *)0x0;
  lVar7 = 0;
  do {
    *(char **)((long)&local_118.m_doc + lVar7) = pcVar2 + (*pcVar2 == '*');
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x10);
  local_118.m_doc = "15DigitalConsumer";
  local_118.m_keywords.first = (keyword *)0x365b27;
  boost::python::objects::class_base::class_base
            ((class_base *)&local_128,"AnalogConsumer",2,(type_info *)&local_118,(char *)0x0);
  boost::python::
  class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  initialize<boost::python::init_base<boost::python::init<HighFreqDataType,int,HFParsingInfo,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>>
            ((class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_128,
             (init_base<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)&local_f8);
  pcVar11 = (class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<void(DigitalConsumer::*)()>
                         ((class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
                           *)&local_128,"initialize",0x11);
  pcVar11 = (class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<timestamp_t(DigitalConsumer_python::*)()>
                         (pcVar11,"getData",(first_type)DigitalConsumer_python::getData_python);
  pcVar11 = (class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<unsigned_long(HFSubConsumer::*)(long)>
                         (pcVar11,"available",(first_type)HFSubConsumer::available);
  pcVar11 = (class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<boost::python::numpy::ndarray(DigitalConsumer_python::*)()>
                         (pcVar11,"create_numpy_array",
                          (first_type)DigitalConsumer_python::create_numpy_array);
  pcVar11 = (class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<long(HFSubConsumer::*)()const>
                         (pcVar11,"lastSysTimestamp",(first_type)HFSubConsumer::lastSysTimestamp);
  boost::python::
  class_<DigitalConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(DigitalConsumer::*)()const>
            (pcVar11,"getChannelsRequested",
             (first_type)DigitalConsumer::getChannelsRequested_abi_cxx11_);
  (local_128.m_ptr)->ob_refcnt = (local_128.m_ptr)->ob_refcnt + -1;
  if ((local_128.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  local_f8.m_doc = (char *)0x0;
  local_f8.m_keywords.first = (keyword *)0x0;
  local_f8.m_keywords.second = (keyword *)0x0;
  lVar7 = 0;
  do {
    *(char **)((long)&local_118.m_doc + lVar7) = pcVar2 + (*pcVar2 == '*');
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x10);
  local_118.m_doc = "14NeuralConsumer";
  local_118.m_keywords.first = (keyword *)0x365b27;
  boost::python::objects::class_base::class_base
            ((class_base *)&local_128,"NeuralConsumer",2,(type_info *)&local_118,(char *)0x0);
  boost::python::
  class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  initialize<boost::python::init_base<boost::python::init<HighFreqDataType,int,HFParsingInfo,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>>
            ((class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_128,
             (init_base<boost::python::init<HighFreqDataType,_int,_HFParsingInfo,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_,_mpl_::void_>_>
              *)&local_f8);
  pcVar12 = (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<void(NeuralConsumer::*)()>
                         ((class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
                           *)&local_128,"initialize",0x11);
  pcVar12 = (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<timestamp_t(NeuralConsumer_python::*)()>
                         (pcVar12,"getData",(first_type)NeuralConsumer_python::getData_python);
  pcVar12 = (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<unsigned_long(HFSubConsumer::*)(long)>
                         (pcVar12,"available",(first_type)HFSubConsumer::available);
  pcVar12 = (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<boost::python::numpy::ndarray(NeuralConsumer_python::*)()>
                         (pcVar12,"create_numpy_array",
                          (first_type)NeuralConsumer_python::create_numpy_array);
  pcVar12 = (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
             *)boost::python::
               class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
               ::def<long(HFSubConsumer::*)()const>
                         (pcVar12,"lastSysTimestamp",(first_type)HFSubConsumer::lastSysTimestamp);
  boost::python::
  class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
  ::
  def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(NeuralConsumer::*)()const>
            (pcVar12,"getChannelsRequested",
             (first_type)NeuralConsumer::getChannelsRequested_abi_cxx11_);
  (local_128.m_ptr)->ob_refcnt = (local_128.m_ptr)->ob_refcnt + -1;
  if ((local_128.m_ptr)->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  local_118.m_doc = (char *)0x0;
  local_118.m_keywords.first = (keyword *)0x0;
  local_118.m_keywords.second = (keyword *)0x0;
  local_f8.m_doc = "20AbstractModuleClient";
  boost::python::objects::class_base::class_base
            ((class_base *)&local_a0,"AbstractModuleClient",1,(type_info *)&local_f8,(char *)0x0);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  initialize<boost::python::init_base<boost::python::init<std::__cxx11::string,std::__cxx11::string,int,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>>>
            ((class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
              *)&local_a0,&local_118);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(PythonModuleClient::*)()>
                         ((class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
                           *)&local_a0,"closeConnections",
                          (first_type)PythonModuleClient::close_python);
  local_f8.m_doc = (char *)&local_28;
  local_28 = PythonModuleClient::default_recv_acquisition;
  local_20 = 0;
  local_128.m_ptr = (PyObject *)0x59;
  local_120 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  local_f8.m_keywords.first = local_b0;
  local_f8.m_keywords.second = local_b0;
  local_e0 = local_b0;
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::detail::def_helper<void(PythonModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (pcVar13,(AbstractModuleClient *)0x0,"recv_acquisition",0x59,
             (def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)0x0,&local_f8,
             (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_128);
  local_f8.m_doc = (char *)&local_38;
  local_38 = PythonModuleClient::default_recv_file_open;
  local_30 = 0;
  local_128.m_ptr = (PyObject *)0x49;
  local_120 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  local_f8.m_keywords.first = local_b0;
  local_f8.m_keywords.second = local_b0;
  local_e0 = local_b0;
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(std::__cxx11::string),boost::python::detail::def_helper<void(PythonModuleClient::*)(std::__cxx11::string),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (pcVar13,(AbstractModuleClient *)0x0,"recv_file_open",0x49,
             (def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)0x0,&local_f8,
             (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_128);
  local_f8.m_doc = (char *)&local_48;
  local_48 = PythonModuleClient::default_recv_file_close;
  local_40 = 0;
  local_128.m_ptr = (PyObject *)0x51;
  local_120 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  local_f8.m_keywords.first = local_b0;
  local_f8.m_keywords.second = local_b0;
  local_e0 = local_b0;
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(),boost::python::detail::def_helper<void(PythonModuleClient::*)(),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (pcVar13,(AbstractModuleClient *)0x0,"recv_file_close",0x51,
             (def_helper<void_(PythonModuleClient::*)(),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)0x0,&local_f8,
             (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_128);
  local_f8.m_doc = (char *)&local_58;
  local_58 = PythonModuleClient::default_recv_source;
  local_50 = 0;
  local_128.m_ptr = (PyObject *)0x61;
  local_120 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  local_f8.m_keywords.first = local_b0;
  local_f8.m_keywords.second = local_b0;
  local_e0 = local_b0;
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(std::__cxx11::string),boost::python::detail::def_helper<void(PythonModuleClient::*)(std::__cxx11::string),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (pcVar13,(AbstractModuleClient *)0x0,"recv_source",0x61,
             (def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)0x0,&local_f8,
             (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_128);
  local_f8.m_doc = (char *)&local_68;
  local_68 = PythonModuleClient::default_recv_quit;
  local_60 = 0;
  local_128.m_ptr = (PyObject *)0x69;
  local_120 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  local_f8.m_keywords.first = local_b0;
  local_f8.m_keywords.second = local_b0;
  local_e0 = local_b0;
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(),boost::python::detail::def_helper<void(PythonModuleClient::*)(),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (pcVar13,(AbstractModuleClient *)0x0,"recv_quit",0x69,
             (def_helper<void_(PythonModuleClient::*)(),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)0x0,&local_f8,
             (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_128);
  local_f8.m_doc = (char *)&local_78;
  local_78 = PythonModuleClient::default_recv_time;
  local_70 = 0;
  local_128.m_ptr = (PyObject *)0x71;
  local_120 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  local_f8.m_keywords.first = local_b0;
  local_f8.m_keywords.second = local_b0;
  local_e0 = local_b0;
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(unsigned_int),boost::python::detail::def_helper<void(PythonModuleClient::*)(unsigned_int),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (pcVar13,(AbstractModuleClient *)0x0,"recv_time",0x71,
             (def_helper<void_(PythonModuleClient::*)(unsigned_int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)0x0,&local_f8,
             (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_128);
  local_f8.m_doc = (char *)&local_88;
  local_88 = PythonModuleClient::default_recv_timerate;
  local_80 = 0;
  local_128.m_ptr = (PyObject *)0x79;
  local_120 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  local_f8.m_keywords.first = local_b0;
  local_f8.m_keywords.second = local_b0;
  local_e0 = local_b0;
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(int),boost::python::detail::def_helper<void(PythonModuleClient::*)(int),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (pcVar13,(AbstractModuleClient *)0x0,"recv_timerate",0x79,
             (def_helper<void_(PythonModuleClient::*)(int),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)0x0,&local_f8,
             (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_128);
  local_f8.m_doc = (char *)&local_98;
  local_98 = PythonModuleClient::default_recv_event;
  local_90 = 0;
  local_128.m_ptr = (PyObject *)0x81;
  local_120 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  local_f8.m_keywords.first = local_b0;
  local_f8.m_keywords.second = local_b0;
  local_e0 = local_b0;
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_impl<AbstractModuleClient,void(AbstractModuleClient::*)(std::__cxx11::string,std::__cxx11::string,TrodesMsg&),boost::python::detail::def_helper<void(PythonModuleClient::*)(std::__cxx11::string,std::__cxx11::string,TrodesMsg&),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
            (pcVar13,(AbstractModuleClient *)0x0,"recv_event",0x81,
             (def_helper<void_(PythonModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TrodesMsg_&),_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
              *)0x0,&local_f8,
             (class_<NeuralConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
              *)&local_128);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<int(MlmWrap::*)()>(pcVar13,"initialize",(first_type)MlmWrap::initialize);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(AbstractModuleClient::*)(std::__cxx11::string,std::__cxx11::string)>
                         (pcVar13,"subscribeToEvent",
                          (first_type)AbstractModuleClient::subscribeToEvent);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(AbstractModuleClient::*)(std::__cxx11::string,std::__cxx11::string)>
                         (pcVar13,"unsubscribeFromEvent",
                          (first_type)AbstractModuleClient::unsubscribeFromEvent);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<void(PythonModuleClient::*)(boost::python::str,boost::python::str,boost::python::list&)>
                         (pcVar13,"sendMsgToTrodes",
                          (first_type)PythonModuleClient::sendMsgToTrodes_python);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<void(PythonModuleClient::*)(boost::python::str,boost::python::str,boost::python::str,boost::python::list&)>
                         (pcVar13,"sendMsgToModule",
                          (first_type)PythonModuleClient::sendMsgToModule_python);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<void(PythonModuleClient::*)(boost::python::str,boost::python::str,boost::python::list&)>
                         (pcVar13,"sendOutEvent",(first_type)PythonModuleClient::sendOutEvent_python
                         );
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(AbstractModuleClient::*)()>
                         (pcVar13,"sendTimeRequest",
                          (first_type)AbstractModuleClient::sendTimeRequest);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(AbstractModuleClient::*)()>
                         (pcVar13,"sendTimeRateRequest",
                          (first_type)AbstractModuleClient::sendTimeRateRequest);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<std::__cxx11::string(MlmWrap::*)()const>
                         (pcVar13,"getID",(first_type)MlmWrap::getID_abi_cxx11_);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(MlmWrap::*)()>
                         (pcVar13,"getClients",(first_type)MlmWrap::getClients_abi_cxx11_);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<int(MlmWrap::*)(HighFreqDataType)>
                         (pcVar13,"registerHighFreqData",(first_type)MlmWrap::registerHighFreqData);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<int(MlmWrap::*)(HighFreqDataType)>
                         (pcVar13,"deregisterHighFreqData",
                          (first_type)MlmWrap::deregisterHighFreqData);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<std::vector<HighFreqDataType,std::allocator<HighFreqDataType>>(MlmWrap::*)()>
                         (pcVar13,"getHighFreqList",(first_type)MlmWrap::getHighFreqList);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_maybe_overloads<HFSubConsumer*(PythonModuleClient::*)(std::__cxx11::string,std::__cxx11::string,unsigned_long),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
            (pcVar13,"subscribeHighFreqData",(first_type)PythonModuleClient::subhfd_python,
             (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
              *)0x0,&local_f8,&local_f8);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_maybe_overloads<HFSubConsumer*(PythonModuleClient::*)(std::__cxx11::string,std::__cxx11::string),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
            (pcVar13,"subscribeHighFreqData",(first_type)PythonModuleClient::subhfd_default_python,
             (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
              *)0x0,&local_128,&local_128);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<int(AbstractModuleClient::*)(std::__cxx11::string,std::__cxx11::string)>
                         (pcVar13,"unsubscribeHighFreqData",
                          (first_type)AbstractModuleClient::unsubscribeHighFreqData);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<int(MlmWrap::*)(char_const*)>
                         (pcVar13,"provideEvent",(first_type)MlmWrap::provideEvent);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<int(MlmWrap::*)(char_const*)>
                         (pcVar13,"unprovideEvent",(first_type)MlmWrap::unprovideEvent);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<std::vector<EventDataType,std::allocator<EventDataType>>(MlmWrap::*)()>
                         (pcVar13,"getEventList",(first_type)MlmWrap::getEventList);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_maybe_overloads<LFPConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
            (pcVar13,"subscribeLFPData",(first_type)PythonModuleClient::sublfpdata_python,
             (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
              *)0x0,&local_a1,&local_a1);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_maybe_overloads<SpikesConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
            (pcVar13,"subscribeSpikesData",(first_type)PythonModuleClient::subspikesdata_python,
             (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
              *)0x0,&local_a2,&local_a2);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_maybe_overloads<AnalogConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
            (pcVar13,"subscribeAnalogData",(first_type)PythonModuleClient::subanalogdata_python,
             (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
              *)0x0,&local_a3,&local_a3);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_maybe_overloads<DigitalConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
            (pcVar13,"subscribeDigitalData",(first_type)PythonModuleClient::subdigitaldata_python,
             (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
              *)0x0,&local_a4,&local_a4);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::
  def_maybe_overloads<NeuralConsumer_python*(PythonModuleClient::*)(unsigned_long,boost::python::list&),boost::python::return_value_policy<boost::python::manage_new_object,boost::python::default_call_policies>>
            (pcVar13,"subscribeNeuralData",(first_type)PythonModuleClient::subneuraldata_python,
             (return_value_policy<boost::python::manage_new_object,_boost::python::default_call_policies>
              *)0x0,&local_a5,&local_a5);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::
               def<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>(AbstractModuleClient::*)(std::__cxx11::string)>
                         (pcVar13,"getAvailableTrodesData",
                          (first_type)AbstractModuleClient::getAvailableTrodesData);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)()>
                         (pcVar13,"initializeHardwareConnection",
                          (first_type)AbstractModuleClient::initializeHardwareConnection);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<void(AbstractModuleClient::*)()>
                         (pcVar13,"destroyHardwareConnection",
                          (first_type)AbstractModuleClient::destroyHardwareConnection);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)()>
                         (pcVar13,"sendSettleCommand",
                          (first_type)AbstractModuleClient::sendSettleCommand);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(StimulationCommand)>
                         (pcVar13,"sendStimulationParams",
                          (first_type)AbstractModuleClient::sendStimulationParams);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(unsigned_short)>
                         (pcVar13,"sendClearStimulationParams",
                          (first_type)AbstractModuleClient::sendClearStimulationParams);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(unsigned_short)>
                         (pcVar13,"sendStimulationStartSlot",
                          (first_type)AbstractModuleClient::sendStimulationStartSlot);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(unsigned_short)>
                         (pcVar13,"sendStimulationStartGroup",
                          (first_type)AbstractModuleClient::sendStimulationStartGroup);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(unsigned_short)>
                         (pcVar13,"sendStimulationStopSlot",
                          (first_type)AbstractModuleClient::sendStimulationStopSlot);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(unsigned_short)>
                         (pcVar13,"sendStimulationStopGroup",
                          (first_type)AbstractModuleClient::sendStimulationStopGroup);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(GlobalStimulationSettings)>
                         (pcVar13,"sendGlobalStimulationSettings",
                          (first_type)AbstractModuleClient::sendGlobalStimulationSettings);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(GlobalStimulationCommand)>
                         (pcVar13,"sendGlobalStimulationCommand",
                          (first_type)AbstractModuleClient::sendGlobalStimulationCommand);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<bool(AbstractModuleClient::*)(unsigned_short)>
                         (pcVar13,"sendStateScriptShortcutMessage",
                          (first_type)AbstractModuleClient::sendStateScriptShortcutMessage);
  pcVar13 = (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
             *)boost::python::
               class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
               ::def<unsigned_int(AbstractModuleClient::*)()>
                         (pcVar13,"latestTrodesTimestamp",
                          (first_type)AbstractModuleClient::latestTrodesTimestamp);
  boost::python::
  class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<void(AbstractModuleClient::*)(std::__cxx11::string)>
            (pcVar13,"sendAnnotationRequest",(first_type)AbstractModuleClient::sendAnnotationRequest
            );
  *local_a0 = *local_a0 + -1;
  if (*local_a0 == 0) {
    _Py_Dealloc();
  }
  return;
}

Assistant:

BOOST_PYTHON_MODULE(trodesnetwork){
    PyEval_InitThreads();
    Py_Initialize();
    np::initialize();
    to_python_converter<std::vector<std::string>, vecToList<std::string> >();
    to_python_converter<std::vector<byte>, vecToList<byte> >();
    to_python_converter<std::vector<int>, vecToList<int> >();
    to_python_converter<std::vector<EventDataType>, EventVecToDict>();
    to_python_converter<std::vector<HighFreqDataType>, vecToList<HighFreqDataType> >();
    to_python_converter<TrodesMsg, TrodesMsgToList>();
    to_python_converter<lfpPacket, lfpPacketToList>();

    scope().attr("TRODES_NETWORK_ID") = TRODES_NETWORK_ID;
    scope().attr("DEFAULT_SERVER_ADDRESS") = DEFAULT_SERVER_ADDRESS;
    scope().attr("DEFAULT_SERVER_PORT") = DEFAULT_SERVER_PORT;
    scope().attr("NEURALSTREAM") = hfType_NEURO;
    scope().attr("ANALOGSTREAM") = hfType_ANALOG;
    scope().attr("DIGITALSTREAM") = hfType_DIGITAL;
    scope().attr("SPIKESTREAM") = hfType_SPIKE;
    scope().attr("LFPSTREAM") = hfType_LFP;
    scope().attr("acq_PLAY") = acq_PLAY;
    scope().attr("acq_STOP") = acq_STOP;
    scope().attr("acq_PAUSE") = acq_PAUSE;
    scope().attr("acq_SEEK") = acq_SEEK;

//    scope().attr("settle_CMD") = settle_CMD;

    class_<timestamp_t>("timestamp_t")
            .add_property("trodes_timestamp", &timestamp_t::trodes_timestamp)
            .add_property("system_timestamp", &timestamp_t::system_timestamp)
            ;
    def("systemTimeMSecs", &CZHelp::systemTimeMSecs);

    class_<HighFreqDataType>
            ("HighFreqDataType")
            .add_property("name", &HighFreqDataType::getName, &HighFreqDataType::setName)
            .add_property("origin", &HighFreqDataType::getOrigin, &HighFreqDataType::setOrigin)
            .add_property("dataFormat", &HighFreqDataType::getDataFormat, &HighFreqDataType::setDataFormat)
            .add_property("address", &HighFreqDataType::getSockAddr, &HighFreqDataType::setSockAddr)
            .add_property("byteSize", &HighFreqDataType::getByteSize, &HighFreqDataType::setByteSize)
            .def("isValid", &HighFreqDataType::isValid)
            .def("print", &HighFreqDataType::print)
            ;

    class_<StimulationCommand>
            ("StimulationCommand", init<>())
//            .def(init<int, int, int, uint16_t, uint8_t, uint16_t, uint8_t, uint16_t, uint16_t, uint16_t>())
            .def("setGroup", &StimulationCommand::setGroup)
            .def("setNoGroup", &StimulationCommand::setNoGroup)
            .def("setSlot", &StimulationCommand::setSlot)
            .def("setChannels",&StimulationCommand::setChannels)
            .def("setBiphasicPulseShape", &StimulationCommand::setBiphasicPulseShape)
            .def("setNumPulsesInTrain", &StimulationCommand::setNumPulsesInTrain)
            .def("isValid", &StimulationCommand::isValid)
            ;

    enum_<GlobalStimulationSettings::CurrentScaling>("CurrentScaling")
            .value("max10nA", GlobalStimulationSettings::max10nA)
            .value("max20nA", GlobalStimulationSettings::max20nA)
            .value("max50nA", GlobalStimulationSettings::max50nA)
            .value("max100nA", GlobalStimulationSettings::max100nA)
            .value("max200nA", GlobalStimulationSettings::max200nA)
            .value("max500nA", GlobalStimulationSettings::max500nA)
            .value("max1uA", GlobalStimulationSettings::max1uA)
            .value("max2uA", GlobalStimulationSettings::max2uA)
            .value("max5uA", GlobalStimulationSettings::max5uA)
            .value("max10uA", GlobalStimulationSettings::max10uA)
            ;

    class_<GlobalStimulationSettings>("GlobalStimulationSettings", init<>())
            .def("setVoltageScale", &GlobalStimulationSettings::setVoltageScale)
            ;

    class_<GlobalStimulationCommand>("GlobalStimulationCommand", init<>())
            .def("setStimEnabled", &GlobalStimulationCommand::setStimEnabled)
            .def("setResetSequencer", &GlobalStimulationCommand::setResetSequencer)
            .def("setAbortStimulation", &GlobalStimulationCommand::setAbortStimulation)
            .def("setClearDSPOffset", &GlobalStimulationCommand::setClearDSPOffset)
            ;
//    void (HighFreqPub::*pubdatax2)(void, size_t) = &HighFreqPub::publishData;
//    void (HighFreqPub::*pubdatax3)(void, size_t, int64_t) = &HighFreqPub::publishData;
//    class_<HighFreqPub, boost::noncopyable>
//            ("HighFreqPub")
//            .def("initialize", &HighFreqPub::initialize)
//            .def("publishData", pubdatax2)
//            .def("publishData", pubdatax3)
//            .def("getAddress", &HighFreqPub::getAddress)
//            ;

    class_<HFSubConsumer_python, boost::noncopyable>
            ("HFSubConsumer", init<HighFreqDataType, int>())
            .def("initialize", &HFSubConsumer_python::initialize)
            .def("readData", static_cast<size_t (HFSubConsumer::*)(np::ndarray)>(&HFSubConsumer_python::readData_python))
            .def("available", &HFSubConsumer_python::available)
            .def("getDataType", &HFSubConsumer_python::getType)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            ;

    class_<HFParsingInfo>("HFParsingInfo")
            .def_readwrite("indices", &HFParsingInfo::indices)
            .def_readwrite("sizeOf", &HFParsingInfo::sizeOf)
            ;

    class_<LFPConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("LFPConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &LFPConsumer_python::initialize)
            .def("getData", &LFPConsumer_python::getData_python)
            .def("available", &LFPConsumer_python::available)
            .def("create_numpy_array", &LFPConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getNTrodesRequested", &LFPConsumer_python::getNTrodesRequested)
            ;

    class_<SpikesConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("SpikesConsumer", init<HighFreqDataType, int, HFParsingInfo, int>())
            .def("initialize", &SpikesConsumer_python::initialize)
            .def("getData",&SpikesConsumer_python::getData_python)
            .def("available", &SpikesConsumer_python::available)
            .def("create_numpy_array", &SpikesConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getNTrodesRequested", &SpikesConsumer_python::getNTrodesRequested)
            ;

    class_<AnalogConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("AnalogConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &AnalogConsumer_python::initialize)
            .def("getData",&AnalogConsumer_python::getData_python)
            .def("available", &AnalogConsumer_python::available)
            .def("create_numpy_array", &AnalogConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getChannelsRequested", &AnalogConsumer::getChannelsRequested)
            ;

    class_<DigitalConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("AnalogConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &DigitalConsumer_python::initialize)
            .def("getData",&DigitalConsumer_python::getData_python)
            .def("available", &DigitalConsumer_python::available)
            .def("create_numpy_array", &DigitalConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getChannelsRequested", &DigitalConsumer::getChannelsRequested)
            ;

    class_<NeuralConsumer_python, bases<HFSubConsumer_python>, boost::noncopyable>
            ("NeuralConsumer", init<HighFreqDataType, int, HFParsingInfo>())
            .def("initialize", &NeuralConsumer_python::initialize)
            .def("getData",&NeuralConsumer_python::getData_python)
            .def("available", &NeuralConsumer_python::available)
            .def("create_numpy_array", &NeuralConsumer_python::create_numpy_array)
            .def("lastSysTimestamp", &HFSubConsumer::lastSysTimestamp)
            .def("getChannelsRequested", &NeuralConsumer::getChannelsRequested)
            ;

    class_<PythonModuleClient, boost::noncopyable>
        ("AbstractModuleClient", init<std::string, std::string, int>())
        .def("closeConnections", &PythonModuleClient::close_python)
        .def("recv_acquisition", &AbstractModuleClient::recv_acquisition,&PythonModuleClient::default_recv_acquisition)
        .def("recv_file_open", &AbstractModuleClient::recv_file_open,&PythonModuleClient::default_recv_file_open)
        .def("recv_file_close", &AbstractModuleClient::recv_file_close,&PythonModuleClient::default_recv_file_close)
        .def("recv_source", &AbstractModuleClient::recv_source,&PythonModuleClient::default_recv_source)
        .def("recv_quit", &AbstractModuleClient::recv_quit,&PythonModuleClient::default_recv_quit)
        .def("recv_time", &AbstractModuleClient::recv_time,&PythonModuleClient::default_recv_time)
        .def("recv_timerate", &AbstractModuleClient::recv_timerate,&PythonModuleClient::default_recv_timerate)
        .def("recv_event", &AbstractModuleClient::recv_event,&PythonModuleClient::default_recv_event)
        .def("initialize", &PythonModuleClient::initialize)
        .def("subscribeToEvent", &PythonModuleClient::subscribeToEvent)
        .def("unsubscribeFromEvent", &PythonModuleClient::unsubscribeFromEvent)
        .def("sendMsgToTrodes", &PythonModuleClient::sendMsgToTrodes_python)
        .def("sendMsgToModule", &PythonModuleClient::sendMsgToModule_python)
        .def("sendOutEvent", &PythonModuleClient::sendOutEvent_python)
        .def("sendTimeRequest", &PythonModuleClient::sendTimeRequest)
        .def("sendTimeRateRequest", &PythonModuleClient::sendTimeRateRequest)
        .def("getID", &PythonModuleClient::getID)
        .def("getClients", &PythonModuleClient::getClients)
        .def("registerHighFreqData", &PythonModuleClient::registerHighFreqData)
        .def("deregisterHighFreqData", &PythonModuleClient::deregisterHighFreqData)
        .def("getHighFreqList", &PythonModuleClient::getHighFreqList)
        .def("subscribeHighFreqData", &PythonModuleClient::subhfd_python, return_value_policy<manage_new_object>())
        .def("subscribeHighFreqData", &PythonModuleClient::subhfd_default_python, return_value_policy<manage_new_object>())
        .def("unsubscribeHighFreqData", &PythonModuleClient::unsubscribeHighFreqData)
        .def("provideEvent", &PythonModuleClient::provideEvent)
        .def("unprovideEvent",&PythonModuleClient::unprovideEvent)
        .def("getEventList", &PythonModuleClient::getEventList)
        .def("subscribeLFPData", &PythonModuleClient::sublfpdata_python, return_value_policy<manage_new_object>())
        .def("subscribeSpikesData", &PythonModuleClient::subspikesdata_python, return_value_policy<manage_new_object>())
        .def("subscribeAnalogData", &PythonModuleClient::subanalogdata_python, return_value_policy<manage_new_object>())
        .def("subscribeDigitalData", &PythonModuleClient::subdigitaldata_python, return_value_policy<manage_new_object>())
        .def("subscribeNeuralData", &PythonModuleClient::subneuraldata_python, return_value_policy<manage_new_object>())
        .def("getAvailableTrodesData", &PythonModuleClient::getAvailableTrodesData)
        .def("initializeHardwareConnection", &PythonModuleClient::initializeHardwareConnection)
        .def("destroyHardwareConnection", &PythonModuleClient::destroyHardwareConnection)
        .def("sendSettleCommand", &PythonModuleClient::sendSettleCommand)
        .def("sendStimulationParams", &PythonModuleClient::sendStimulationParams)
        .def("sendClearStimulationParams", &PythonModuleClient::sendClearStimulationParams)
        .def("sendStimulationStartSlot", &PythonModuleClient::sendStimulationStartSlot)
        .def("sendStimulationStartGroup",&PythonModuleClient::sendStimulationStartGroup)
        .def("sendStimulationStopSlot", &PythonModuleClient::sendStimulationStopSlot)
        .def("sendStimulationStopGroup",&PythonModuleClient::sendStimulationStopGroup)
        .def("sendGlobalStimulationSettings", &PythonModuleClient::sendGlobalStimulationSettings)
        .def("sendGlobalStimulationCommand", &PythonModuleClient::sendGlobalStimulationCommand)
        .def("sendStateScriptShortcutMessage", &PythonModuleClient::sendStateScriptShortcutMessage)
        .def("latestTrodesTimestamp", &PythonModuleClient::latestTrodesTimestamp)
        .def("sendAnnotationRequest", &PythonModuleClient::sendAnnotationRequest)
        ;
}